

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O1

uint Extra_TruthCanonNPN(uint uTruth,int nVars)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  int Polarity;
  uint uVar5;
  bool bVar6;
  int local_38;
  
  if (Extra_TruthCanonNPN::pPerms == (char **)0x0) {
    if (nVars < 1) {
LAB_0041740c:
      Extra_TruthCanonNPN::nPerms = 1;
    }
    else {
      Extra_TruthCanonNPN::nPerms = 1;
      iVar1 = 1;
      do {
        Extra_TruthCanonNPN::nPerms = Extra_TruthCanonNPN::nPerms * iVar1;
        bVar6 = iVar1 != nVars;
        iVar1 = iVar1 + 1;
      } while (bVar6);
    }
  }
  else {
    if (Extra_TruthCanonNPN::nVarsOld == nVars) goto LAB_0041742b;
    free(Extra_TruthCanonNPN::pPerms);
    Extra_TruthCanonNPN::pPerms = (char **)0x0;
    if (nVars < 1) goto LAB_0041740c;
    Extra_TruthCanonNPN::nPerms = 1;
    iVar1 = 1;
    do {
      Extra_TruthCanonNPN::nPerms = Extra_TruthCanonNPN::nPerms * iVar1;
      bVar6 = iVar1 != nVars;
      iVar1 = iVar1 + 1;
    } while (bVar6);
  }
  Extra_TruthCanonNPN::pPerms = Extra_Permutations(nVars);
  Extra_TruthCanonNPN::nVarsOld = nVars;
LAB_0041742b:
  iVar1 = 1 << ((byte)nVars & 0x1f);
  uVar5 = 0xffffffff;
  if (nVars != 0x1f) {
    local_38 = 1;
    if (1 < iVar1) {
      local_38 = iVar1;
    }
    Polarity = 0;
    do {
      uVar2 = Extra_TruthPolarize(uTruth,Polarity,nVars);
      if (0 < Extra_TruthCanonNPN::nPerms) {
        lVar4 = 0;
        do {
          uVar3 = Extra_TruthPermute(uVar2,Extra_TruthCanonNPN::pPerms[lVar4],nVars,0);
          if (uVar3 <= uVar5) {
            uVar5 = uVar3;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < Extra_TruthCanonNPN::nPerms);
      }
      uVar2 = Extra_TruthPolarize((~uTruth << (-(char)iVar1 & 0x1fU)) >> (-(char)iVar1 & 0x1fU),
                                  Polarity,nVars);
      if (0 < Extra_TruthCanonNPN::nPerms) {
        lVar4 = 0;
        do {
          uVar3 = Extra_TruthPermute(uVar2,Extra_TruthCanonNPN::pPerms[lVar4],nVars,0);
          if (uVar3 <= uVar5) {
            uVar5 = uVar3;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < Extra_TruthCanonNPN::nPerms);
      }
      Polarity = Polarity + 1;
    } while (Polarity != local_38);
  }
  return uVar5;
}

Assistant:

unsigned Extra_TruthCanonNPN( unsigned uTruth, int nVars )
{
    static int nVarsOld, nPerms;
    static char ** pPerms = NULL;

    unsigned uTruthMin, uTruthC, uPhase, uPerm;
    int nMints, k, i;

    if ( pPerms == NULL )
    {
        nPerms = Extra_Factorial( nVars );   
        pPerms = Extra_Permutations( nVars );
        nVarsOld = nVars;
    }
    else if ( nVarsOld != nVars )
    {
        ABC_FREE( pPerms );
        nPerms = Extra_Factorial( nVars );   
        pPerms = Extra_Permutations( nVars );
        nVarsOld = nVars;
    }

    nMints    = (1 << nVars);
    uTruthC   = (unsigned)( (~uTruth) & ((~((unsigned)0)) >> (32-nMints)) );
    uTruthMin = 0xFFFFFFFF;
    for ( i = 0; i < nMints; i++ )
    {
        uPhase = Extra_TruthPolarize( uTruth, i, nVars ); 
        for ( k = 0; k < nPerms; k++ )
        {
            uPerm = Extra_TruthPermute( uPhase, pPerms[k], nVars, 0 );
            if ( uTruthMin > uPerm )
                uTruthMin = uPerm;
        }
        uPhase = Extra_TruthPolarize( uTruthC, i, nVars ); 
        for ( k = 0; k < nPerms; k++ )
        {
            uPerm = Extra_TruthPermute( uPhase, pPerms[k], nVars, 0 );
            if ( uTruthMin > uPerm )
                uTruthMin = uPerm;
        }
    }
    return uTruthMin;
}